

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eco_dns.cpp
# Opt level: O0

eco_ip_t eco::eco_dns_query(char *domain,char **ip)

{
  int iVar1;
  char **ip_local;
  char *domain_local;
  
  *ip = (char *)0x0;
  iVar1 = eco_internal_dns_query(domain,ip,ECO_QR_V4);
  if (iVar1 == 0) {
    domain_local._4_4_ = ECO_IPV4;
  }
  else {
    iVar1 = eco_internal_dns_query(domain,ip,ECO_QR_V6);
    if (iVar1 == 0) {
      domain_local._4_4_ = ECO_IPV6;
    }
    else {
      domain_local._4_4_ = ECO_FAIL;
    }
  }
  return domain_local._4_4_;
}

Assistant:

eco_ip_t eco::eco_dns_query(const char* domain, char **ip)
{

  *ip = nullptr;

  if (!eco_internal_dns_query(domain, ip, ECO_QR_V4))
    return ECO_IPV4;

  if (!eco_internal_dns_query(domain, ip, ECO_QR_V6))
    return ECO_IPV6;

  return ECO_FAIL;

}